

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O0

bool __thiscall ON_PlugInRef::Read(ON_PlugInRef *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_PlugInRef *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_1c = 0;
  local_20 = 0;
  local_21 = ON_BinaryArchive::BeginRead3dmChunk
                       (_minor_version,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if (local_21) {
    if ((iStack_1c == 1) && (-1 < local_20)) {
      if (local_21) {
        local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plugin_id);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_plugin_type);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_plugin_name);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_plugin_version);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_plugin_filename);
      }
      if (0 < local_20) {
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_organization);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_address);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_country);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_phone);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_email);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_website);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_updateurl);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_developer_fax);
        }
        if (1 < local_20) {
          if (local_21 != false) {
            local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_plugin_platform);
          }
          if (local_21 != false) {
            local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_plugin_sdk_version);
          }
          if (local_21 != false) {
            local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_plugin_sdk_service_release)
            ;
          }
        }
      }
    }
    else {
      local_21 = false;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_21 = false;
    }
  }
  return local_21;
}

Assistant:

bool ON_PlugInRef::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;

  bool rc = file.BeginRead3dmChunk(
                  TCODE_ANONYMOUS_CHUNK,
                  &major_version,
                  &minor_version);

  if (rc)
  {
    if( 1 == major_version && minor_version >= 0 )
    {
      //version 1.0 fields
      if (rc) rc = file.ReadUuid(m_plugin_id);
      if (rc) rc = file.ReadInt(&m_plugin_type);
      if (rc) rc = file.ReadString(m_plugin_name);
      if (rc) rc = file.ReadString(m_plugin_version);
      if (rc) rc = file.ReadString(m_plugin_filename);

      if ( minor_version >= 1)
      {
        // version 1.1 fields
        if (rc) rc = file.ReadString(m_developer_organization);
        if (rc) rc = file.ReadString(m_developer_address);
        if (rc) rc = file.ReadString(m_developer_country);
        if (rc) rc = file.ReadString(m_developer_phone);
        if (rc) rc = file.ReadString(m_developer_email);
        if (rc) rc = file.ReadString(m_developer_website);
        if (rc) rc = file.ReadString(m_developer_updateurl);
        if (rc) rc = file.ReadString(m_developer_fax);

        if ( minor_version >= 2 )
        {
          if (rc) rc = file.ReadInt(&m_plugin_platform);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_version);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_service_release);
        }
      }
    }
    else
    {
      rc = false;
    }

    if( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}